

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O0

Subtests * __thiscall
hwtest::pgraph::PGraphScanTests::subtests_abi_cxx11_
          (Subtests *__return_storage_ptr__,PGraphScanTests *this)

{
  TestOptions *pTVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>
  __l;
  ScanAccessTest *this_00;
  result_type rVar2;
  ScanDebugTest *this_01;
  ScanControlTest *this_02;
  ScanCanvasTest *this_03;
  ScanVtxTest *this_04;
  ScanClipTest *this_05;
  ScanContextTest *this_06;
  ScanVStateTest *this_07;
  ScanDmaTest *this_08;
  ScanD3D0Test *this_09;
  ScanD3D56Test *this_10;
  ScanFe3dTest *this_11;
  ScanCelsiusTest *this_12;
  ScanKelvinTest *this_13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  *local_4c8;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>
  local_2e1;
  ScanKelvinTest *local_2e0;
  ScanCelsiusTest *local_2d8;
  ScanFe3dTest *local_2d0;
  ScanD3D56Test *local_2c8;
  ScanD3D0Test *local_2c0;
  ScanDmaTest *local_2b8;
  ScanVStateTest *local_2b0;
  ScanContextTest *local_2a8;
  ScanClipTest *local_2a0;
  ScanVtxTest *local_298;
  ScanCanvasTest *local_290;
  ScanControlTest *local_288;
  ScanDebugTest *local_280 [3];
  ScanAccessTest *local_268;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  *local_260;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_230;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_208;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_1e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_190;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  local_50;
  iterator local_28;
  size_type local_20;
  PGraphScanTests *local_18;
  PGraphScanTests *this_local;
  
  local_260 = &local_258;
  local_18 = this;
  this_local = (PGraphScanTests *)__return_storage_ptr__;
  this_00 = (ScanAccessTest *)operator_new(0x13c0);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanAccessTest::ScanAccessTest(this_00,pTVar1,(uint32_t)rVar2);
  local_268 = this_00;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[7],_hwtest::pgraph::(anonymous_namespace)::ScanAccessTest_*,_true>
            (&local_258,(char (*) [7])0x3a051a,&local_268);
  local_260 = &local_230;
  this_01 = (ScanDebugTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanDebugTest::ScanDebugTest(this_01,pTVar1,(uint32_t)rVar2);
  local_280[0] = this_01;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[6],_hwtest::pgraph::(anonymous_namespace)::ScanDebugTest_*,_true>
            (&local_230,(char (*) [6])0x396344,local_280);
  local_260 = &local_208;
  this_02 = (ScanControlTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanControlTest::ScanControlTest(this_02,pTVar1,(uint32_t)rVar2);
  local_288 = this_02;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[8],_hwtest::pgraph::(anonymous_namespace)::ScanControlTest_*,_true>
            (&local_208,(char (*) [8])0x396369,&local_288);
  local_260 = &local_1e0;
  this_03 = (ScanCanvasTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanCanvasTest::ScanCanvasTest(this_03,pTVar1,(uint32_t)rVar2);
  local_290 = this_03;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[7],_hwtest::pgraph::(anonymous_namespace)::ScanCanvasTest_*,_true>
            (&local_1e0,(char (*) [7])0x3963b4,&local_290);
  local_260 = &local_1b8;
  this_04 = (ScanVtxTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanVtxTest::ScanVtxTest(this_04,pTVar1,(uint32_t)rVar2);
  local_298 = this_04;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[4],_hwtest::pgraph::(anonymous_namespace)::ScanVtxTest_*,_true>
            (&local_1b8,(char (*) [4])0x398be0,&local_298);
  local_260 = &local_190;
  this_05 = (ScanClipTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanClipTest::ScanClipTest(this_05,pTVar1,(uint32_t)rVar2);
  local_2a0 = this_05;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[5],_hwtest::pgraph::(anonymous_namespace)::ScanClipTest_*,_true>
            (&local_190,(char (*) [5])0x391470,&local_2a0);
  local_260 = &local_168;
  this_06 = (ScanContextTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanContextTest::ScanContextTest(this_06,pTVar1,(uint32_t)rVar2);
  local_2a8 = this_06;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[8],_hwtest::pgraph::(anonymous_namespace)::ScanContextTest_*,_true>
            (&local_168,(char (*) [8])"context",&local_2a8);
  local_260 = &local_140;
  this_07 = (ScanVStateTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanVStateTest::ScanVStateTest(this_07,pTVar1,(uint32_t)rVar2);
  local_2b0 = this_07;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[7],_hwtest::pgraph::(anonymous_namespace)::ScanVStateTest_*,_true>
            (&local_140,(char (*) [7])0x396393,&local_2b0);
  local_260 = &local_118;
  this_08 = (ScanDmaTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanDmaTest::ScanDmaTest(this_08,pTVar1,(uint32_t)rVar2);
  local_2b8 = this_08;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[4],_hwtest::pgraph::(anonymous_namespace)::ScanDmaTest_*,_true>
            (&local_118,(char (*) [4])0x3963fa,&local_2b8);
  local_260 = &local_f0;
  this_09 = (ScanD3D0Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanD3D0Test::ScanD3D0Test(this_09,pTVar1,(uint32_t)rVar2);
  local_2c0 = this_09;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[5],_hwtest::pgraph::(anonymous_namespace)::ScanD3D0Test_*,_true>
            (&local_f0,(char (*) [5])0x3963c6,&local_2c0);
  local_260 = &local_c8;
  this_10 = (ScanD3D56Test *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanD3D56Test::ScanD3D56Test(this_10,pTVar1,(uint32_t)rVar2);
  local_2c8 = this_10;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[6],_hwtest::pgraph::(anonymous_namespace)::ScanD3D56Test_*,_true>
            (&local_c8,(char (*) [6])0x3963d6,&local_2c8);
  local_260 = &local_a0;
  this_11 = (ScanFe3dTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanFe3dTest::ScanFe3dTest(this_11,pTVar1,(uint32_t)rVar2);
  local_2d0 = this_11;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[5],_hwtest::pgraph::(anonymous_namespace)::ScanFe3dTest_*,_true>
            (&local_a0,(char (*) [5])"fe3d",&local_2d0);
  local_260 = &local_78;
  this_12 = (ScanCelsiusTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanCelsiusTest::ScanCelsiusTest(this_12,pTVar1,(uint32_t)rVar2);
  local_2d8 = this_12;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[8],_hwtest::pgraph::(anonymous_namespace)::ScanCelsiusTest_*,_true>
            (&local_78,(char (*) [8])0x3963e7,&local_2d8);
  local_260 = &local_50;
  this_13 = (ScanKelvinTest *)operator_new(0x13c8);
  pTVar1 = (this->super_Test).opt;
  rVar2 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Test).rnd);
  anon_unknown_2::ScanKelvinTest::ScanKelvinTest(this_13,pTVar1,(uint32_t)rVar2);
  local_2e0 = this_13;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
  ::pair<const_char_(&)[7],_hwtest::pgraph::(anonymous_namespace)::ScanKelvinTest_*,_true>
            (&local_50,(char (*) [7])"kelvin",&local_2e0);
  local_28 = &local_258;
  local_20 = 0xe;
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>
  ::allocator(&local_2e1);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>_>
  ::vector(__return_storage_ptr__,__l,&local_2e1);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>_>
  ::~allocator(&local_2e1);
  local_4c8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
               *)&local_28;
  do {
    local_4c8 = local_4c8 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hwtest::Test_*>
    ::~pair(local_4c8);
  } while (local_4c8 != &local_258);
  return __return_storage_ptr__;
}

Assistant:

Test::Subtests PGraphScanTests::subtests() {
	return {
		{"access", new ScanAccessTest(opt, rnd())},
		{"debug", new ScanDebugTest(opt, rnd())},
		{"control", new ScanControlTest(opt, rnd())},
		{"canvas", new ScanCanvasTest(opt, rnd())},
		{"vtx", new ScanVtxTest(opt, rnd())},
		{"clip", new ScanClipTest(opt, rnd())},
		{"context", new ScanContextTest(opt, rnd())},
		{"vstate", new ScanVStateTest(opt, rnd())},
		{"dma", new ScanDmaTest(opt, rnd())},
		{"d3d0", new ScanD3D0Test(opt, rnd())},
		{"d3d56", new ScanD3D56Test(opt, rnd())},
		{"fe3d", new ScanFe3dTest(opt, rnd())},
		{"celsius", new ScanCelsiusTest(opt, rnd())},
		{"kelvin", new ScanKelvinTest(opt, rnd())},
	};
}